

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O3

int nv_cksum(uint8_t *data,uint length)

{
  ulong uVar1;
  char cVar2;
  
  if (length != 0) {
    uVar1 = 0;
    cVar2 = '\0';
    do {
      cVar2 = cVar2 + data[uVar1];
      uVar1 = uVar1 + 1;
    } while (length != uVar1);
    if (cVar2 != '\0') {
      nv_cksum_cold_1();
      return -1;
    }
  }
  return 1;
}

Assistant:

static int nv_cksum(const uint8_t *data, unsigned int length)
{
	/*
	 * There's a few checksums in the BIOS, so here's a generic checking
	 * function.
	 */
	int i;
	uint8_t sum = 0;

	for (i = 0; i < length; i++)
		sum += data[i];

	if (sum) {
		fprintf(stderr, "Invalid checksum. Broken vbios or broken retrieval method?\n");
		return ECRC;
	}
	return EOK;
}